

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O0

string * perf::format_duration_abi_cxx11_(duration *time)

{
  rep rVar1;
  ostream *poVar2;
  string *in_RDI;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> ns;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> mus;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> ms;
  __enable_if_is_duration<std::chrono::duration<long>_> s;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<60L>_>_> m;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<3600L>_>_> h;
  stringstream strm;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffd28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1d8;
  duration<long,_std::ratio<1L,_1000000L>_> local_1d0;
  duration<long,_std::ratio<1L,_1000L>_> local_1c8;
  duration<long,_std::ratio<1L,_1L>_> local_1c0;
  duration<long,_std::ratio<60L,_1L>_> local_1b8;
  undefined4 local_1b0;
  duration<long,_std::ratio<3600L,_1L>_> local_1a0;
  stringstream local_198 [16];
  undefined1 local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_fffffffffffffd28);
  rVar1 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_1a0);
  if (rVar1 < 1) {
    local_1b8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                        (in_stack_fffffffffffffd28);
    rVar1 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1b8);
    if (rVar1 < 1) {
      local_1c0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_fffffffffffffd28);
      rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_1c0);
      if (rVar1 < 10) {
        local_1c8.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                            (in_stack_fffffffffffffd28);
        rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1c8);
        if (rVar1 < 1) {
          local_1d0.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                              (in_stack_fffffffffffffd28);
          rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1d0);
          if (rVar1 < 1) {
            local_1d8.__r =
                 (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_fffffffffffffd28);
            rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_1d8);
            poVar2 = (ostream *)std::ostream::operator<<(local_188,rVar1);
            std::operator<<(poVar2," ns");
            std::__cxx11::stringstream::str();
          }
          else {
            rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1d0);
            poVar2 = (ostream *)std::ostream::operator<<(local_188,rVar1);
            std::operator<<(poVar2,anon_var_dwarf_94bc);
            std::__cxx11::stringstream::str();
          }
        }
        else {
          rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1c8);
          poVar2 = (ostream *)std::ostream::operator<<(local_188,rVar1);
          std::operator<<(poVar2," ms");
          std::__cxx11::stringstream::str();
        }
      }
      else {
        rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_1c0);
        poVar2 = (ostream *)std::ostream::operator<<(local_188,rVar1);
        std::operator<<(poVar2," s");
        std::__cxx11::stringstream::str();
      }
    }
    else {
      rVar1 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1b8);
      poVar2 = (ostream *)std::ostream::operator<<(local_188,rVar1);
      std::operator<<(poVar2," min");
      std::__cxx11::stringstream::str();
    }
  }
  else {
    rVar1 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_1a0);
    poVar2 = (ostream *)std::ostream::operator<<(local_188,rVar1);
    std::operator<<(poVar2," h");
    std::__cxx11::stringstream::str();
  }
  local_1b0 = 1;
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string format_duration(const duration &time)
    {
        std::stringstream strm;

        auto h = std::chrono::duration_cast<hours>(time);
        if (h.count() >= 1l)
        {
            strm << h.count() << " h";
            return strm.str();
        }

        auto m = std::chrono::duration_cast<minutes>(time);
        if (m.count() >= 1l)
        {
            strm << m.count() << " min";
            return strm.str();
        }

        auto s = std::chrono::duration_cast<seconds>(time);
        if (s.count() >= 10l)
        {
            strm << s.count() << " s";
            return strm.str();
        }

        auto ms = std::chrono::duration_cast<milliseconds>(time);
        if (ms.count() >= 1l)
        {
            strm << ms.count() << " ms";
            return strm.str();
        }

        auto mus = std::chrono::duration_cast<microseconds>(time);
        if (mus.count() >= 1l)
        {
            strm << mus.count() << " \u03BCs";
            return strm.str();
        }

        auto ns = std::chrono::duration_cast<nanoseconds>(time);
        strm << ns.count() << " ns";
        return strm.str();
    }